

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O1

int libssh2_publickey_list_fetch
              (LIBSSH2_PUBLICKEY *pkey,unsigned_long *num_keys,libssh2_publickey_list **pkey_list)

{
  uchar **data;
  size_t *data_len;
  uchar **pdata;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uchar *in_RAX;
  ulong uVar6;
  libssh2_publickey_list *plVar7;
  ulong uVar8;
  libssh2_publickey_attribute *plVar9;
  uchar *puVar10;
  uchar *puVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  uchar *puVar16;
  libssh2_publickey_list *local_78;
  int local_5c;
  ulong local_48;
  
  if (pkey == (LIBSSH2_PUBLICKEY *)0x0) {
    return -0x27;
  }
  channel = pkey->channel;
  session = channel->session;
  if (pkey->listFetch_state == libssh2_NB_state_idle) {
    pkey->listFetch_data = (uchar *)0x0;
    pkey->listFetch_s = pkey->listFetch_buffer;
    _libssh2_htonu32(pkey->listFetch_buffer,8);
    puVar10 = pkey->listFetch_s;
    pkey->listFetch_s = puVar10 + 4;
    _libssh2_htonu32(puVar10 + 4,4);
    in_RAX = pkey->listFetch_s;
    pkey->listFetch_s = in_RAX + 4;
    builtin_memcpy(in_RAX + 4,"list",4);
    pkey->listFetch_s = pkey->listFetch_s + 4;
    pkey->listFetch_state = libssh2_NB_state_created;
  }
  local_5c = (int)in_RAX;
  if (pkey->listFetch_state == libssh2_NB_state_created) {
    puVar10 = pkey->listFetch_buffer;
    bVar1 = false;
    uVar6 = _libssh2_channel_write(channel,0,puVar10,(long)pkey->listFetch_s - (long)puVar10);
    if (uVar6 == 0xffffffffffffffdb) {
      uVar6 = 0xffffffdb;
    }
    else if ((long)pkey->listFetch_s - (long)puVar10 == uVar6) {
      pkey->listFetch_state = libssh2_NB_state_sent;
      bVar1 = true;
    }
    else {
      pkey->listFetch_state = libssh2_NB_state_idle;
      uVar2 = _libssh2_error(session,-7,"Unable to send publickey list packet");
      uVar6 = (ulong)uVar2;
      bVar1 = false;
    }
    local_5c = (int)uVar6;
    if (!bVar1) {
      return local_5c;
    }
  }
  data = &pkey->listFetch_data;
  data_len = &pkey->listFetch_data_len;
  pdata = &pkey->listFetch_s;
  local_48 = 0;
  local_78 = (libssh2_publickey_list *)0x0;
  uVar6 = 0;
  do {
    iVar3 = publickey_packet_receive(pkey,data,data_len);
    if (iVar3 != 0) {
      if (iVar3 != -0x25) {
        _libssh2_error(session,-0x1e,"Timeout waiting for response from publickey subsystem");
LAB_001212a8:
        if (*data != (uchar *)0x0) {
          (*session->free)(*data,&session->abstract);
          *data = (uchar *)0x0;
        }
        if (local_78 != (libssh2_publickey_list *)0x0) {
          libssh2_publickey_list_free(pkey,local_78);
        }
        pkey->listFetch_state = libssh2_NB_state_idle;
        iVar3 = -1;
      }
      return iVar3;
    }
    *pdata = *data;
    iVar3 = publickey_response_id(pdata,*data_len);
    if (iVar3 < 0) {
      _libssh2_error(session,-0x24,"Invalid publickey subsystem response code");
      goto LAB_001212a8;
    }
    if (iVar3 == 2) {
      if (local_48 <= uVar6) {
        sVar15 = local_48 * 0x38 + 0x1f8;
        if (local_78 == (libssh2_publickey_list *)0x0) {
          plVar7 = (libssh2_publickey_list *)(*session->alloc)(sVar15,&session->abstract);
        }
        else {
          plVar7 = (libssh2_publickey_list *)(*session->realloc)(local_78,sVar15,&session->abstract)
          ;
        }
        iVar3 = 0;
        if (plVar7 == (libssh2_publickey_list *)0x0) {
          _libssh2_error(session,-6,"Unable to allocate memory for publickey list");
          iVar3 = 6;
          plVar7 = local_78;
        }
        local_78 = plVar7;
        if (iVar3 == 0) {
          local_48 = local_48 + 8;
          goto LAB_00120d42;
        }
LAB_0012129d:
        if (iVar3 != 6) {
          return local_5c;
        }
        goto LAB_001212a8;
      }
LAB_00120d42:
      puVar10 = pkey->listFetch_s;
      if (pkey->version == 1) {
        if (pkey->listFetch_data + pkey->listFetch_data_len < puVar10 + 4) {
LAB_00120d70:
          iVar3 = -0x26;
          pcVar12 = "ListFetch data too short";
LAB_00120d7f:
          _libssh2_error(session,iVar3,pcVar12);
          iVar3 = 6;
        }
        else {
          uVar4 = _libssh2_ntohu32(puVar10);
          *pdata = *pdata + 4;
          if (uVar4 != 0) {
            local_78[uVar6].num_attrs = 1;
            plVar9 = (libssh2_publickey_attribute *)(*session->alloc)(0x28,&session->abstract);
            local_78[uVar6].attrs = plVar9;
            if (plVar9 != (libssh2_publickey_attribute *)0x0) {
              plVar9->name = "comment";
              plVar9->name_len = 7;
              puVar10 = *pdata;
              plVar9->value = (char *)puVar10;
              plVar9->value_len = (ulong)uVar4;
              plVar9->mandatory = '\0';
              *pdata = puVar10 + uVar4;
              goto LAB_00120fee;
            }
            iVar3 = -6;
            pcVar12 = "Unable to allocate memory for publickey attributes";
            goto LAB_00120d7f;
          }
          local_78[uVar6].num_attrs = 0;
          (&local_78[uVar6].num_attrs)[1] = 0;
LAB_00120fee:
          if (*data + *data_len < *pdata + 4) {
            _libssh2_error(session,-0x26,"ListFetch data too short");
            iVar3 = 6;
          }
          else {
            uVar4 = _libssh2_ntohu32(*pdata);
            uVar14 = (ulong)uVar4;
            local_78[uVar6].name_len = uVar14;
            puVar10 = *pdata;
            *pdata = puVar10 + 4;
            puVar16 = puVar10 + uVar14 + 4;
            puVar11 = *data;
            sVar15 = *data_len;
            if (puVar16 <= puVar11 + sVar15) {
              local_78[uVar6].name = puVar10 + 4;
              *pdata = puVar16;
              if (puVar11 + sVar15 < puVar10 + uVar14 + 8) goto LAB_00120d70;
              uVar4 = _libssh2_ntohu32(puVar16);
              local_78[uVar6].blob_len = (ulong)uVar4;
              puVar11 = *pdata;
              puVar10 = puVar11 + 4;
              *pdata = puVar10;
              puVar11 = puVar11 + (ulong)uVar4 + 4;
              if (puVar11 <= *data + *data_len) {
                local_78[uVar6].blob = puVar10;
                *pdata = puVar11;
                iVar3 = 0;
                goto LAB_0012107a;
              }
            }
            _libssh2_error(session,-0x26,"ListFetch data too short");
            iVar3 = 6;
          }
        }
LAB_0012107a:
        if (iVar3 != 0) goto LAB_0012129d;
      }
      else {
        if (pkey->listFetch_data + pkey->listFetch_data_len < puVar10 + 4) goto LAB_0012118d;
        uVar4 = _libssh2_ntohu32(puVar10);
        local_78[uVar6].name_len = (ulong)uVar4;
        puVar11 = *pdata;
        puVar10 = puVar11 + 4;
        *pdata = puVar10;
        puVar11 = puVar11 + (ulong)uVar4 + 4;
        puVar16 = *data;
        sVar15 = *data_len;
        if (puVar16 + sVar15 < puVar11) {
          _libssh2_error(session,-0x26,"ListFetch data too short");
          goto LAB_001212a8;
        }
        local_78[uVar6].name = puVar10;
        *pdata = puVar11;
        if (puVar16 + sVar15 < puVar11 + 4) {
LAB_0012118d:
          pcVar12 = "ListFetch data too short";
          iVar3 = -0x26;
LAB_00121195:
          _libssh2_error(session,iVar3,pcVar12);
          goto LAB_001212a8;
        }
        uVar4 = _libssh2_ntohu32(puVar11);
        local_78[uVar6].blob_len = (ulong)uVar4;
        puVar11 = *pdata;
        puVar10 = puVar11 + 4;
        *pdata = puVar10;
        puVar11 = puVar11 + (ulong)uVar4 + 4;
        puVar16 = *data;
        sVar15 = *data_len;
        if (puVar16 + sVar15 < puVar11) goto LAB_0012118d;
        local_78[uVar6].blob = puVar10;
        *pdata = puVar11;
        if (puVar16 + sVar15 < puVar11 + 4) goto LAB_0012118d;
        uVar4 = _libssh2_ntohu32(puVar11);
        local_78[uVar6].num_attrs = (ulong)uVar4;
        *pdata = *pdata + 4;
        if (uVar4 != 0) {
          plVar9 = (libssh2_publickey_attribute *)
                   (*session->alloc)((ulong)uVar4 * 0x28,&session->abstract);
          local_78[uVar6].attrs = plVar9;
          if (plVar9 != (libssh2_publickey_attribute *)0x0) {
            if (local_78[uVar6].num_attrs != 0) {
              lVar13 = 0;
              uVar14 = 0;
              do {
                if (*data + *data_len < *pdata + 4) {
                  _libssh2_error(session,-0x26,"ListFetch data too short");
                  goto LAB_001212a8;
                }
                uVar4 = _libssh2_ntohu32(*pdata);
                uVar8 = (ulong)uVar4;
                plVar9 = local_78[uVar6].attrs;
                *(ulong *)((long)&plVar9->name_len + lVar13) = uVar8;
                puVar11 = *pdata + 4;
                *pdata = puVar11;
                puVar10 = *data;
                sVar15 = *data_len;
                if (puVar10 + sVar15 < puVar11 + *(long *)((long)&plVar9->name_len + lVar13))
                goto LAB_0012118d;
                *(uchar **)((long)&plVar9->name + lVar13) = puVar11;
                *pdata = puVar11 + uVar8;
                if (puVar10 + sVar15 < puVar11 + uVar8 + 4) goto LAB_0012118d;
                uVar4 = _libssh2_ntohu32(puVar11 + uVar8);
                plVar9 = local_78[uVar6].attrs;
                *(ulong *)((long)&plVar9->value_len + lVar13) = (ulong)uVar4;
                puVar10 = *pdata + 4;
                *pdata = puVar10;
                if (*data + *data_len < puVar10 + *(long *)((long)&plVar9->value_len + lVar13))
                goto LAB_0012118d;
                *(uchar **)((long)&plVar9->value + lVar13) = puVar10;
                *pdata = puVar10 + uVar4;
                (&plVar9->mandatory)[lVar13] = '\0';
                uVar14 = uVar14 + 1;
                lVar13 = lVar13 + 0x28;
              } while (uVar14 < local_78[uVar6].num_attrs);
            }
            goto LAB_00121082;
          }
          pcVar12 = "Unable to allocate memory for publickey attributes";
          iVar3 = -6;
          goto LAB_00121195;
        }
        local_78[uVar6].attrs = (libssh2_publickey_attribute *)0x0;
      }
LAB_00121082:
      local_78[uVar6].packet = *data;
      uVar14 = uVar6 + 1;
      local_78[uVar6 + 1].packet = (uchar *)0x0;
    }
    else {
      if (iVar3 == 0) {
        if (*data + *data_len < *pdata + 8) {
LAB_00121262:
          _libssh2_error(session,-0x26,"ListFetch data too short");
LAB_0012127b:
          bVar1 = true;
        }
        else {
          uVar4 = _libssh2_ntohu32(*pdata);
          puVar10 = *pdata;
          *pdata = puVar10 + 4;
          uVar5 = _libssh2_ntohu32(puVar10 + 4);
          puVar10 = *pdata;
          *pdata = puVar10 + 4;
          if (*data + *data_len < puVar10 + (ulong)uVar5 + 8) goto LAB_00121262;
          *pdata = puVar10 + (ulong)uVar5 + 4;
          uVar5 = _libssh2_ntohu32(puVar10 + (ulong)uVar5 + 4);
          puVar10 = *pdata;
          *pdata = puVar10 + 4;
          puVar10 = puVar10 + (ulong)uVar5 + 4;
          if (*data + *data_len < puVar10) goto LAB_00121262;
          *pdata = puVar10;
          if ((ulong)uVar4 != 0) {
            publickey_status_error(pkey,session,(ulong)uVar4);
            goto LAB_0012127b;
          }
          (*session->free)(*data,&session->abstract);
          pkey->listFetch_data = (uchar *)0x0;
          *pkey_list = local_78;
          *num_keys = uVar6;
          pkey->listFetch_state = libssh2_NB_state_idle;
          bVar1 = false;
          local_5c = 0;
        }
        if (!bVar1) {
          return local_5c;
        }
        goto LAB_001212a8;
      }
      _libssh2_error(session,-0x24,"Unexpected publickey subsystem response");
      (*session->free)(*data,&session->abstract);
      uVar14 = uVar6;
    }
    *data = (uchar *)0x0;
    uVar6 = uVar14;
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_publickey_list_fetch(LIBSSH2_PUBLICKEY * pkey, unsigned long *num_keys,
                             libssh2_publickey_list ** pkey_list)
{
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_SESSION *session;
    libssh2_publickey_list *list = NULL;
    unsigned long buffer_len = 12, keys = 0, max_keys = 0, i;
    /* 12 = packet_len(4) + list_len(4) + "list"(4) */
    int response;
    int rc;

    if(!pkey)
        return LIBSSH2_ERROR_BAD_USE;

    channel = pkey->channel;
    session = channel->session;

    if(pkey->listFetch_state == libssh2_NB_state_idle) {
        pkey->listFetch_data = NULL;

        pkey->listFetch_s = pkey->listFetch_buffer;
        _libssh2_htonu32(pkey->listFetch_s, (uint32_t)(buffer_len - 4));
        pkey->listFetch_s += 4;
        _libssh2_htonu32(pkey->listFetch_s, sizeof("list") - 1);
        pkey->listFetch_s += 4;
        memcpy(pkey->listFetch_s, "list", sizeof("list") - 1);
        pkey->listFetch_s += sizeof("list") - 1;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Sending publickey \"list\" packet"));

        pkey->listFetch_state = libssh2_NB_state_created;
    }

    if(pkey->listFetch_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0,
                                          pkey->listFetch_buffer,
                                          (pkey->listFetch_s -
                                           pkey->listFetch_buffer));
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((pkey->listFetch_s - pkey->listFetch_buffer) != nwritten) {
            pkey->listFetch_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send publickey list packet");
        }

        pkey->listFetch_state = libssh2_NB_state_sent;
    }

    for(;;) {
        rc = publickey_packet_receive(pkey, &pkey->listFetch_data,
                                      &pkey->listFetch_data_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                           "Timeout waiting for response from "
                           "publickey subsystem");
            goto err_exit;
        }

        pkey->listFetch_s = pkey->listFetch_data;
        if((response =
             publickey_response_id(&pkey->listFetch_s,
                                   pkey->listFetch_data_len)) < 0) {
            _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                           "Invalid publickey subsystem response code");
            goto err_exit;
        }

        switch(response) {
        case LIBSSH2_PUBLICKEY_RESPONSE_STATUS:
            /* Error, or processing complete */
        {
            unsigned long status, descr_len, lang_len;

            if(pkey->listFetch_s + 8 <=
               pkey->listFetch_data + pkey->listFetch_data_len) {
                status = _libssh2_ntohu32(pkey->listFetch_s);
                pkey->listFetch_s += 4;
                descr_len = _libssh2_ntohu32(pkey->listFetch_s);
                pkey->listFetch_s += 4;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "ListFetch data too short");
                goto err_exit;
            }

            if(pkey->listFetch_s + descr_len + 4 <=
               pkey->listFetch_data + pkey->listFetch_data_len) {
                /* description starts at pkey->listFetch_s */
                pkey->listFetch_s += descr_len;
                lang_len = _libssh2_ntohu32(pkey->listFetch_s);
                pkey->listFetch_s += 4;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "ListFetch data too short");
                goto err_exit;
            }

            if(pkey->listFetch_s + lang_len <=
               pkey->listFetch_data + pkey->listFetch_data_len) {
                /* lang starts at pkey->listFetch_s */
                pkey->listFetch_s += lang_len;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "ListFetch data too short");
                goto err_exit;
            }

            if(pkey->listFetch_s >
                pkey->listFetch_data + pkey->listFetch_data_len) {
                _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                               "Malformed publickey subsystem packet");
                goto err_exit;
            }

            if(status == LIBSSH2_PUBLICKEY_SUCCESS) {
                LIBSSH2_FREE(session, pkey->listFetch_data);
                pkey->listFetch_data = NULL;
                *pkey_list = list;
                *num_keys = keys;
                pkey->listFetch_state = libssh2_NB_state_idle;
                return 0;
            }

            publickey_status_error(pkey, session, status);
            goto err_exit;
        }
        case LIBSSH2_PUBLICKEY_RESPONSE_PUBLICKEY:
            /* What we want */
            if(keys >= max_keys) {
                libssh2_publickey_list *newlist;
                /* Grow the key list if necessary */
                max_keys += 8;
                newlist =
                    LIBSSH2_REALLOC(session, list,
                                    (max_keys +
                                     1) * sizeof(libssh2_publickey_list));
                if(!newlist) {
                    _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                   "Unable to allocate memory for "
                                   "publickey list");
                    goto err_exit;
                }
                list = newlist;
            }
            if(pkey->version == 1) {
                unsigned long comment_len;

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    comment_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(comment_len) {
                    list[keys].num_attrs = 1;
                    list[keys].attrs =
                        LIBSSH2_ALLOC(session,
                                      sizeof(libssh2_publickey_attribute));
                    if(!list[keys].attrs) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Unable to allocate memory for "
                                       "publickey attributes");
                        goto err_exit;
                    }
                    list[keys].attrs[0].name = "comment";
                    list[keys].attrs[0].name_len = sizeof("comment") - 1;
                    list[keys].attrs[0].value = (char *) pkey->listFetch_s;
                    list[keys].attrs[0].value_len = comment_len;
                    list[keys].attrs[0].mandatory = 0;

                    pkey->listFetch_s += comment_len;
                }
                else {
                    list[keys].num_attrs = 0;
                    list[keys].attrs = NULL;
                }

                if(pkey->listFetch_s + 4 <=
                    pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].name_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].name_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].blob_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].blob_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }
            }
            else {
                /* Version == 2 */

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].name_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].name_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].blob_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].blob_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].num_attrs = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(list[keys].num_attrs) {
                    list[keys].attrs =
                        LIBSSH2_ALLOC(session,
                                      list[keys].num_attrs *
                                      sizeof(libssh2_publickey_attribute));
                    if(!list[keys].attrs) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Unable to allocate memory for "
                                       "publickey attributes");
                        goto err_exit;
                    }
                    for(i = 0; i < list[keys].num_attrs; i++) {
                        if(pkey->listFetch_s + 4 <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].name_len =
                                _libssh2_ntohu32(pkey->listFetch_s);
                            pkey->listFetch_s += 4;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        if(pkey->listFetch_s + list[keys].attrs[i].name_len <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].name =
                                (char *) pkey->listFetch_s;
                            pkey->listFetch_s += list[keys].attrs[i].name_len;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        if(pkey->listFetch_s + 4 <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].value_len =
                                _libssh2_ntohu32(pkey->listFetch_s);
                            pkey->listFetch_s += 4;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        if(pkey->listFetch_s +
                           list[keys].attrs[i].value_len <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].value =
                                (char *) pkey->listFetch_s;
                            pkey->listFetch_s += list[keys].attrs[i].value_len;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        /* actually an ignored value */
                        list[keys].attrs[i].mandatory = 0;
                    }
                }
                else {
                    list[keys].attrs = NULL;
                }
            }
            /* To be FREEd in libssh2_publickey_list_free() */
            list[keys].packet = pkey->listFetch_data;
            keys++;

            list[keys].packet = NULL;   /* Terminate the list */
            pkey->listFetch_data = NULL;
            break;
        default:
            /* Unknown/Unexpected */
            _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                           "Unexpected publickey subsystem response");
            LIBSSH2_FREE(session, pkey->listFetch_data);
            pkey->listFetch_data = NULL;
        }
    }

    /* Only reached via explicit goto */
err_exit:
    if(pkey->listFetch_data) {
        LIBSSH2_FREE(session, pkey->listFetch_data);
        pkey->listFetch_data = NULL;
    }
    if(list) {
        libssh2_publickey_list_free(pkey, list);
    }
    pkey->listFetch_state = libssh2_NB_state_idle;
    return -1;
}